

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lifetime.h
# Opt level: O0

void __thiscall
Lifetime::AddToUseCountAdjust(Lifetime *this,uint32 newUseValue,Loop *loop,Func *func)

{
  JitArenaAllocator *pJVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar5;
  uint *puVar6;
  TrackAllocData local_88;
  code *local_60;
  undefined8 local_58;
  TrackAllocData local_50;
  Func *local_28;
  Func *func_local;
  Loop *loop_local;
  Lifetime *pLStack_10;
  uint32 newUseValue_local;
  Lifetime *this_local;
  
  local_28 = func;
  func_local = (Func *)loop;
  loop_local._4_4_ = newUseValue;
  pLStack_10 = this;
  if (this->useCountAdjust + newUseValue < this->useCountAdjust) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lifetime.h"
                       ,0x91,"((this->useCountAdjust + newUseValue) >= this->useCountAdjust)",
                       "(this->useCountAdjust + newUseValue) >= this->useCountAdjust");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this->useCountAdjust = loop_local._4_4_ + this->useCountAdjust;
  if (func_local != (Func *)0x0) {
    if (this->regionUseCount == (uint32 *)0x0) {
      pJVar1 = this->alloc;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_50,(type_info *)&unsigned_int::typeinfo,0,(ulong)(local_28->loopCount + 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lifetime.h"
                 ,0x98);
      pAVar5 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                              pJVar1,&local_50);
      local_60 = Memory::ArenaAllocator::AllocZero;
      local_58 = 0;
      puVar6 = Memory::AllocateArray<Memory::ArenaAllocator,unsigned_int,false>
                         ((Memory *)pAVar5,(ArenaAllocator *)Memory::ArenaAllocator::AllocZero,0,
                          (ulong)(local_28->loopCount + 1));
      this->regionUseCount = puVar6;
      pJVar1 = this->alloc;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_88,(type_info *)&unsigned_int::typeinfo,0,(ulong)(local_28->loopCount + 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lifetime.h"
                 ,0x99);
      pAVar5 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                              pJVar1,&local_88);
      puVar6 = Memory::AllocateArray<Memory::ArenaAllocator,unsigned_int,false>
                         ((Memory *)pAVar5,(ArenaAllocator *)Memory::ArenaAllocator::AllocZero,0,
                          (ulong)(local_28->loopCount + 1));
      this->regionUseCountAdjust = puVar6;
    }
    do {
      this->regionUseCountAdjust[*(uint *)&func_local->m_scriptContextInfo] =
           loop_local._4_4_ + this->regionUseCountAdjust[*(uint *)&func_local->m_scriptContextInfo];
      func_local = (Func *)func_local->pinnedTypeRefs;
    } while (func_local != (Func *)0x0);
  }
  return;
}

Assistant:

void AddToUseCountAdjust(uint32 newUseValue, Loop *loop, Func *func)
    {
        Assert((this->useCountAdjust + newUseValue) >= this->useCountAdjust);
        this->useCountAdjust += newUseValue;

        if (loop)
        {
            if (!this->regionUseCount)
            {
                this->regionUseCount = AnewArrayZ(this->alloc, uint32, func->loopCount+1);
                this->regionUseCountAdjust = AnewArrayZ(this->alloc, uint32, func->loopCount+1);
            }
            do
            {
                this->regionUseCountAdjust[loop->loopNumber] += newUseValue;
                loop = loop->parent;
            } while (loop);
        }
    }